

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O0

void __thiscall QUtcTimeZonePrivate::~QUtcTimeZonePrivate(QUtcTimeZonePrivate *this)

{
  QString::~QString((QString *)0x73cef0);
  QString::~QString((QString *)0x73cefe);
  QString::~QString((QString *)0x73cf0c);
  QTimeZonePrivate::~QTimeZonePrivate((QTimeZonePrivate *)0x73cf16);
  return;
}

Assistant:

QUtcTimeZonePrivate::~QUtcTimeZonePrivate()
{
}